

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation-pipe.cpp
# Opt level: O1

void load_memory(void)

{
  fseek((FILE *)file,(ulong)cadr,0);
  fread(memory + vadr,1,(ulong)csize,(FILE *)file);
  fseek((FILE *)file,(ulong)dadr,0);
  fread(memory + gp,1,dsize,(FILE *)file);
  fseek((FILE *)file,(ulong)sdata_offset,0);
  fread(memory + sdata_adr,1,sdata_size,(FILE *)file);
  fclose((FILE *)file);
  return;
}

Assistant:

void load_memory()
{
    fseek(file,cadr,SEEK_SET);
    fread(&memory[vadr],1,csize,file);
    fseek(file,dadr,SEEK_SET);
    fread(&memory[gp],1,dsize,file);
    fseek(file,sdata_offset,SEEK_SET);
    fread(&memory[sdata_adr], 1, sdata_size, file);

    //vadr=vadr>>2;
    //csize=csize>>2;
    fclose(file);
}